

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

RC __thiscall QO_Manager::CalculateOptJoin(QO_Manager *this,int relsInJoin,int relSize)

{
  uint newRel;
  uint *puVar1;
  uint relsInJoin_00;
  RC RVar2;
  uint *puVar3;
  int indexCond;
  int indexAttr;
  float totalTuples;
  float cost;
  QO_Manager *local_80;
  vector<int,_std::allocator<int>_> relsInJoinVec;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> attrStats;
  
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = this;
  ConvertBitmapToVec(this,relsInJoin,&relsInJoinVec);
  puVar1 = (uint *)operator_new(0x48);
  puVar1[0] = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *(uint **)(puVar1 + 0xc) = puVar1 + 8;
  *(uint **)(puVar1 + 0xe) = puVar1 + 8;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[3] = 0x7f7fffff;
  puVar1[4] = 0xffffffff;
  puVar1[5] = 0xffffffff;
  if (relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar3 = (uint *)relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      newRel = *puVar3;
      if (0x20 < newRel) {
        RVar2 = 0x19b;
        goto LAB_0011539b;
      }
      relsInJoin_00 = relsInJoin & ~(1 << (newRel & 0x1f));
      attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &attrStats._M_t._M_impl.super__Rb_tree_header._M_header;
      attrStats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      indexAttr = -1;
      indexCond = -1;
      attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      CalculateJoin(local_80,relsInJoin_00,newRel,relSize,&cost,&totalTuples,
                    (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                     *)&attrStats._M_t,&indexAttr,&indexCond);
      if (cost < (float)puVar1[3]) {
        puVar1[3] = (uint)cost;
        std::
        _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
        ::clear((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                 *)(puVar1 + 6));
        std::
        _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
        ::operator=((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                     *)(puVar1 + 6),&attrStats._M_t);
        *puVar1 = relsInJoin_00;
        puVar1[1] = *puVar3;
        puVar1[2] = (uint)totalTuples;
        puVar1[4] = indexAttr;
        puVar1[5] = indexCond;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
      ::~_Rb_tree(&attrStats._M_t);
      puVar3 = puVar3 + 1;
    } while (puVar3 != (uint *)relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  attrStats._M_t._M_impl._0_4_ = relsInJoin;
  attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar1;
  std::
  _Rb_tree<int,std::pair<int_const,costElem*>,std::_Select1st<std::pair<int_const,costElem*>>,std::less<int>,std::allocator<std::pair<int_const,costElem*>>>
  ::_M_insert_unique<std::pair<int_const,costElem*>>
            ((_Rb_tree<int,std::pair<int_const,costElem*>,std::_Select1st<std::pair<int_const,costElem*>>,std::less<int>,std::allocator<std::pair<int_const,costElem*>>>
              *)((local_80->optcost).
                 super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + relSize),
             (pair<const_int,_costElem_*> *)&attrStats);
  RVar2 = 0;
LAB_0011539b:
  if (relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return RVar2;
}

Assistant:

RC QO_Manager::CalculateOptJoin(int relsInJoin, int relSize){
  RC rc = 0;
  // create a vector of these relations in the bitmap
  vector<int> relsInJoinVec;
  ConvertBitmapToVec(relsInJoin, relsInJoinVec);

  // Create a cost element, and initialize its values
  vector<int>::iterator it;
  costElem *costTable = new costElem();
  costTable->cost = FLT_MAX;
  costTable->indexAttr = -1;
  costTable->indexCond = -1;
  // iterate through all ways of removing a relation a
  for(it = relsInJoinVec.begin(); it != relsInJoinVec.end(); ++it){
    int subJoin = relsInJoin;
    if((rc = RemoveRelFromBitmap(*it, subJoin)))
      return (rc);

    float cost;
    map<int, attrStat> attrStats;
    float totalTuples;
    int indexAttr = -1;
    int indexCond = -1;
    // Calculate the a join (S-a)
    if((rc = CalculateJoin(subJoin, *it, relSize, cost, totalTuples, attrStats, indexAttr, indexCond)))
      return (rc);
    // if the cost is the smallest so far, update all values
    if(cost < costTable->cost){ 
      costTable->cost = cost;
      costTable->attrs.clear();
      costTable->attrs = attrStats;
      costTable->joins = subJoin;
      costTable->newRelIndex = *it;
      costTable->numTuples = totalTuples;
      costTable->indexAttr = indexAttr;
      costTable->indexCond = indexCond;
    }
  }
  // insert the costElem as the optimal way of arriving
  // at this join
  optcost[relSize].insert({relsInJoin, costTable});

  return (0);
}